

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,longlong *val)

{
  int iVar1;
  longlong *plVar2;
  longlong size_00;
  longlong lVar3;
  longlong size;
  longlong id;
  long len;
  long status;
  longlong available;
  longlong total;
  longlong *val_local;
  unsigned_long expected_id_local;
  longlong *pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (*pos < 0)) {
    pReader_local._7_1_ = false;
  }
  else {
    available = 0;
    status = 0;
    total = (longlong)val;
    val_local = (longlong *)expected_id;
    expected_id_local = (unsigned_long)pos;
    pos_local = (longlong *)pReader;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&available,&status);
    len = (long)iVar1;
    if ((len < 0) || ((-1 < available && (available < status)))) {
      pReader_local._7_1_ = false;
    }
    else {
      id = 0;
      plVar2 = (longlong *)ReadID((IMkvReader *)pos_local,*(longlong *)expected_id_local,&id);
      if (((long)plVar2 < 0) || (id < status - *(long *)expected_id_local)) {
        pReader_local._7_1_ = false;
      }
      else if (plVar2 == val_local) {
        *(longlong *)expected_id_local = id + *(long *)expected_id_local;
        size_00 = ReadUInt((IMkvReader *)pos_local,*(longlong *)expected_id_local,&id);
        if ((((size_00 < 0) || (8 < size_00)) || (id < 1)) ||
           ((8 < id || (id < status - *(long *)expected_id_local)))) {
          pReader_local._7_1_ = false;
        }
        else {
          *(longlong *)expected_id_local = id + *(long *)expected_id_local;
          lVar3 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)expected_id_local,size_00);
          *(longlong *)total = lVar3;
          if (*(long *)total < 0) {
            pReader_local._7_1_ = false;
          }
          else {
            *(longlong *)expected_id_local = size_00 + *(long *)expected_id_local;
            pReader_local._7_1_ = true;
          }
        }
      }
      else {
        pReader_local._7_1_ = false;
      }
    }
  }
  return pReader_local._7_1_;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           long long& val) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  const long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;

  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || size > 8 || len < 1 || len > 8 || (available - pos) > len)
    return false;

  pos += len;  // consume length of size of payload

  val = UnserializeUInt(pReader, pos, size);
  if (val < 0)
    return false;

  pos += size;  // consume size of payload

  return true;
}